

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O1

void __thiscall
QSslCertificate::QSslCertificate(QSslCertificate *this,QIODevice *device,EncodingFormat format)

{
  QSslCertificatePrivate *this_00;
  QTlsBackend *pQVar1;
  code *pcVar2;
  iterator iVar3;
  QLoggingCategory *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<QSslCertificate> local_68;
  QArrayData *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QSslCertificatePrivate *)operator_new(0x10);
  QSslCertificatePrivate::QSslCertificatePrivate(this_00);
  (this->d).d.ptr = this_00;
  LOCK();
  (this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int> + 1);
  UNLOCK();
  if (device != (QIODevice *)0x0) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QIODevice::readAll();
    if (local_38 != (undefined1 *)0x0) {
      pQVar1 = QTlsBackend::activeOrAnyBackend();
      if (pQVar1 != (QTlsBackend *)0x0) {
        pcVar2 = (code *)(**(code **)(*(long *)pQVar1 + 0xe8 + (ulong)(format != Pem) * 8))(pQVar1);
        if (pcVar2 == (code *)0x0) {
          this_01 = QtPrivateLogging::lcSsl();
          if (((this_01->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
            QSslCertificate((QSslCertificate *)this_01);
          }
        }
        else {
          local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_68.d._0_4_ = 0xaaaaaaaa;
          local_68.d._4_4_ = 0xaaaaaaaa;
          local_68.ptr._0_4_ = 0xaaaaaaaa;
          local_68.ptr._4_4_ = 0xaaaaaaaa;
          (*pcVar2)(&local_68,&local_48,1);
          if ((undefined1 *)local_68.size != (undefined1 *)0x0) {
            iVar3 = QList<QSslCertificate>::begin((QList<QSslCertificate> *)&local_68);
            QExplicitlySharedDataPointer<QSslCertificatePrivate>::reset
                      (&this->d,((iVar3.i)->d).d.ptr);
          }
          QArrayDataPointer<QSslCertificate>::~QArrayDataPointer(&local_68);
        }
      }
    }
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSslCertificate::QSslCertificate(QIODevice *device, QSsl::EncodingFormat format)
    : d(new QSslCertificatePrivate)
{
    if (device) {
        const auto data = device->readAll();
        if (data.isEmpty())
            return;

        const auto *tlsBackend = QTlsBackend::activeOrAnyBackend();
        if (!tlsBackend)
            return;

        auto *X509Reader = format == QSsl::Pem ? tlsBackend->X509PemReader() : tlsBackend->X509DerReader();
        if (!X509Reader) {
            qCWarning(lcSsl, "Current TLS plugin does not support reading from PEM/DER");
            return;
        }

        QList<QSslCertificate> certs = X509Reader(data, 1);
        if (!certs.isEmpty())
            d = certs.first().d;
    }
}